

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
gl3cts::TransformFeedbackOverflowQueryBasicSingleStreamSeparateAttribs::iterate
          (TransformFeedbackOverflowQueryBasicSingleStreamSeparateAttribs *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  TransformFeedbackOverflowQueryBasicSingleStreamSeparateAttribs *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_TransformFeedbackOverflowQuerySingleStreamBase).
                      super_TransformFeedbackOverflowQueryFunctionalBase.
                      super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x30))(4);
  TransformFeedbackOverflowQueryFunctionalBase::drawTriangles
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,4);
  (**(code **)(lVar3 + 0x638))();
  TransformFeedbackOverflowQueryFunctionalBase::verifyQueryResults
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,'\0');
  (**(code **)(lVar3 + 0x30))(4);
  TransformFeedbackOverflowQueryFunctionalBase::drawTriangles
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,5);
  (**(code **)(lVar3 + 0x638))();
  TransformFeedbackOverflowQueryFunctionalBase::verifyQueryResults
            ((TransformFeedbackOverflowQueryFunctionalBase *)this,'\x01');
  tcu::TestContext::setTestResult
            ((this->super_TransformFeedbackOverflowQuerySingleStreamBase).
             super_TransformFeedbackOverflowQueryFunctionalBase.
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

IterateResult iterate()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		// Call BeginTransformFeedback with mode TRIANGLES.
		gl.beginTransformFeedback(GL_TRIANGLES);

		// Start the query, submit draw that results in feeding back exactly 4
		// triangles, then stop the query.
		drawTriangles(4);

		// Call EndTransformFeedback.
		gl.endTransformFeedback();

		// Use the basic checking mechanism to validate that the result of the
		// query is FALSE.
		verifyQueryResults(GL_FALSE);

		// Repeat the above steps, but this time feed back exactly 5 triangles
		// and expect the result of the query to be TRUE.
		gl.beginTransformFeedback(GL_TRIANGLES);
		drawTriangles(5);
		gl.endTransformFeedback();
		verifyQueryResults(GL_TRUE);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}